

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_dist_to_tri(REF_NODE ref_node,REF_INT *nodes,REF_DBL *xyz,REF_DBL *distance)

{
  double dVar1;
  double dVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  REF_DBL projection;
  REF_INT edge_nodes [2];
  REF_DBL edge_dist2;
  REF_DBL edge_dist1;
  REF_DBL edge_dist0;
  double local_70;
  REF_INT local_68;
  REF_INT local_64;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  uVar4 = ref_node_tri_projection(ref_node,nodes,xyz,&local_70);
  if (uVar4 == 0) {
    if (local_70 <= -local_70) {
      local_70 = -local_70;
    }
    uStack_40 = 0;
    local_68 = nodes[1];
    local_64 = nodes[2];
    local_48 = local_70;
    uVar4 = ref_node_dist_to_edge(ref_node,&local_68,xyz,&local_50);
    if (uVar4 == 0) {
      local_68 = nodes[2];
      local_64 = *nodes;
      uVar4 = ref_node_dist_to_edge(ref_node,&local_68,xyz,&local_58);
      if (uVar4 == 0) {
        local_68 = *nodes;
        local_64 = nodes[1];
        uVar4 = ref_node_dist_to_edge(ref_node,&local_68,xyz,&local_60);
        if (uVar4 == 0) {
          pRVar3 = ref_node->real;
          lVar5 = (long)*nodes;
          dVar8 = *xyz;
          dVar1 = xyz[1];
          dVar2 = xyz[2];
          lVar6 = (long)nodes[1];
          dVar7 = (dVar2 - pRVar3[lVar5 * 0xf + 2]) * (dVar2 - pRVar3[lVar5 * 0xf + 2]) +
                  (dVar1 - pRVar3[lVar5 * 0xf + 1]) * (dVar1 - pRVar3[lVar5 * 0xf + 1]) +
                  (dVar8 - pRVar3[lVar5 * 0xf]) * (dVar8 - pRVar3[lVar5 * 0xf]);
          dVar9 = (dVar2 - pRVar3[lVar6 * 0xf + 2]) * (dVar2 - pRVar3[lVar6 * 0xf + 2]) +
                  (dVar1 - pRVar3[lVar6 * 0xf + 1]) * (dVar1 - pRVar3[lVar6 * 0xf + 1]) +
                  (dVar8 - pRVar3[lVar6 * 0xf]) * (dVar8 - pRVar3[lVar6 * 0xf]);
          lVar5 = (long)nodes[2];
          dVar8 = (dVar2 - pRVar3[lVar5 * 0xf + 2]) * (dVar2 - pRVar3[lVar5 * 0xf + 2]) +
                  (dVar1 - pRVar3[lVar5 * 0xf + 1]) * (dVar1 - pRVar3[lVar5 * 0xf + 1]) +
                  (dVar8 - pRVar3[lVar5 * 0xf]) * (dVar8 - pRVar3[lVar5 * 0xf]);
          if (dVar8 <= dVar9) {
            dVar9 = dVar8;
          }
          if (local_50 <= local_48) {
            local_48 = local_50;
          }
          if (dVar9 <= dVar7) {
            dVar7 = dVar9;
          }
          if (local_60 <= local_58) {
            local_58 = local_60;
          }
          if (local_58 <= local_48) {
            local_48 = local_58;
          }
          if (dVar7 <= local_48) {
            local_48 = dVar7;
          }
          *distance = local_48;
          uVar4 = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xc4f,"ref_node_dist_to_tri",(ulong)uVar4,"e2");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0xc4c,"ref_node_dist_to_tri",(ulong)uVar4,"e1");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xc49,
             "ref_node_dist_to_tri",(ulong)uVar4,"e0");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xc45,
           "ref_node_dist_to_tri",(ulong)uVar4,"proj");
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_node_dist_to_tri(REF_NODE ref_node, REF_INT *nodes,
                                        REF_DBL *xyz, REF_DBL *distance) {
  REF_DBL projection;
  REF_DBL edge_dist0, edge_dist1, edge_dist2;
  REF_DBL node_dist0, node_dist1, node_dist2;
  REF_INT edge_nodes[2];
  RSS(ref_node_tri_projection(ref_node, nodes, xyz, &projection), "proj");
  projection = ABS(projection);
  edge_nodes[0] = nodes[1];
  edge_nodes[1] = nodes[2];
  RSS(ref_node_dist_to_edge(ref_node, edge_nodes, xyz, &edge_dist0), "e0");
  edge_nodes[0] = nodes[2];
  edge_nodes[1] = nodes[0];
  RSS(ref_node_dist_to_edge(ref_node, edge_nodes, xyz, &edge_dist1), "e1");
  edge_nodes[0] = nodes[0];
  edge_nodes[1] = nodes[1];
  RSS(ref_node_dist_to_edge(ref_node, edge_nodes, xyz, &edge_dist2), "e2");
  node_dist0 = pow(xyz[0] - ref_node_xyz(ref_node, 0, nodes[0]), 2) +
               pow(xyz[1] - ref_node_xyz(ref_node, 1, nodes[0]), 2) +
               pow(xyz[2] - ref_node_xyz(ref_node, 2, nodes[0]), 2);
  node_dist1 = pow(xyz[0] - ref_node_xyz(ref_node, 0, nodes[1]), 2) +
               pow(xyz[1] - ref_node_xyz(ref_node, 1, nodes[1]), 2) +
               pow(xyz[2] - ref_node_xyz(ref_node, 2, nodes[1]), 2);
  node_dist2 = pow(xyz[0] - ref_node_xyz(ref_node, 0, nodes[2]), 2) +
               pow(xyz[1] - ref_node_xyz(ref_node, 1, nodes[2]), 2) +
               pow(xyz[2] - ref_node_xyz(ref_node, 2, nodes[2]), 2);
  *distance = MIN(MIN(MIN(projection, edge_dist0), MIN(edge_dist1, edge_dist2)),
                  MIN(node_dist0, MIN(node_dist1, node_dist2)));

  return REF_SUCCESS;
}